

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitRefCast
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,RefCast *curr)

{
  char cVar1;
  Literal *this_00;
  uchar uVar2;
  SmallVector<wasm::Literal,_1UL> local_188;
  pointer local_150;
  size_t sStack_148;
  undefined1 local_140 [8];
  Flow ref;
  Literal val;
  pointer local_a8;
  size_t sStack_a0;
  undefined1 local_98 [8];
  Cast cast;
  
  visit((Flow *)local_140,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_140 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    wasm::Literal::Literal((Literal *)&stack0xffffffffffffff20,(Literal *)&ref);
    cVar1 = wasm::Type::isSubType
                      ((Type)val.field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(Type)*(uintptr_t *)(curr + 8));
    if (cVar1 == '\0') {
      wasm::Literal::Literal
                ((Literal *)
                 &cast.state.
                  super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ._M_index,(Literal *)&stack0xffffffffffffff20);
      wasm::Literal::Literal
                ((Literal *)&local_188,
                 (Literal *)
                 &cast.state.
                  super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ._M_index);
      uVar2 = '\x02';
      wasm::Literal::Literal((Literal *)local_98,(Literal *)&local_188);
    }
    else {
      wasm::Literal::Literal
                ((Literal *)
                 &cast.state.
                  super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ._M_index,(Literal *)&stack0xffffffffffffff20);
      wasm::Literal::Literal
                ((Literal *)&local_188,
                 (Literal *)
                 &cast.state.
                  super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ._M_index);
      uVar2 = '\x01';
      wasm::Literal::Literal((Literal *)local_98,(Literal *)&local_188);
    }
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._M_first._M_storage._M_storage[0x40] = uVar2;
    wasm::Literal::~Literal((Literal *)&local_188);
    wasm::Literal::~Literal
              ((Literal *)
               &cast.state.
                super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                ._M_index);
    this_00 = (Literal *)&stack0xffffffffffffff20;
  }
  else {
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_188,(SmallVector<wasm::Literal,_1UL> *)local_140);
    local_150 = ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    sStack_148 = ref.breakTo.super_IString.str._M_len;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff20,&local_188);
    local_a8 = local_150;
    sStack_a0 = sStack_148;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_98,
               (SmallVector<wasm::Literal,_1UL> *)&stack0xffffffffffffff20);
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._48_8_ = local_a8;
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._56_8_ = sStack_a0;
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._M_first._M_storage._M_storage[0x40] = '\0';
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff40);
    wasm::Literal::~Literal(&val);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_188.flexible);
    this_00 = local_188.fixed._M_elems;
  }
  wasm::Literal::~Literal(this_00);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ref);
  if (cast.state.
      super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      ._M_u._M_first._M_storage._M_storage[0x40] == '\0') {
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
               (SmallVector<wasm::Literal,_1UL> *)local_98);
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         cast.state.
         super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         ._M_u._48_8_;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)cast.state.
                 super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 ._M_u._56_8_;
  }
  else {
    if (cast.state.
        super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        ._M_u._M_first._M_storage._M_storage[0x40] != '\x01') {
      if (cast.state.
          super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
          .
          super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
          .
          super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
          .
          super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
          .
          super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
          .
          super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
          ._M_u._M_first._M_storage._M_storage[0x40] != '\x02') {
        __assert_fail("cast.getFailure()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x685,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitRefCast(RefCast *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
      (*this->_vptr_ExpressionRunner[2])(this,"cast error");
      wasm::handle_unreachable
                ("unreachable",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x687);
    }
    wasm::Literal::Literal((Literal *)&ref.breakTo.super_IString.str._M_str,(Literal *)local_98);
    Flow::Flow(__return_storage_ptr__,(Literal *)&ref.breakTo.super_IString.str._M_str);
    wasm::Literal::~Literal((Literal *)&ref.breakTo.super_IString.str._M_str);
  }
  if ((long)(char)cast.state.
                  super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ._M_u._M_first._M_storage._M_storage[0x40] != -1) {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>_&>
      ::_S_vtable._M_arr
      [(char)cast.state.
             super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             ._M_u._M_first._M_storage._M_storage[0x40]]._M_data)
              ((anon_class_1_0_00000001 *)local_140,
               (variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefCast(RefCast* curr) {
    NOTE_ENTER("RefCast");
    auto cast = doCast(curr);
    if (auto* breaking = cast.getBreaking()) {
      return *breaking;
    } else if (auto* result = cast.getSuccess()) {
      return *result;
    }
    assert(cast.getFailure());
    trap("cast error");
    WASM_UNREACHABLE("unreachable");
  }